

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
~CustomLayerParams_CustomLayerParamValue(CustomLayerParams_CustomLayerParamValue *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if (this->_oneof_case_[0] != 0) {
      clear_value(this);
      uVar1 = this_00->ptr_;
    }
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::~CustomLayerParams_CustomLayerParamValue() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}